

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

exception<ki::dml::parse_error> *
pybind11::register_exception<ki::dml::parse_error>(handle scope,char *name,PyObject *base)

{
  object *this;
  internals *piVar1;
  _Fwd_list_node_base *p_Var2;
  object local_30;
  
  this = &detail::get_exception_object<ki::dml::parse_error>()->super_object;
  if ((this->super_handle).m_ptr == (PyObject *)0x0) {
    exception<ki::dml::parse_error>::exception
              ((exception<ki::dml::parse_error> *)&local_30,scope,name,base);
    object::operator=(this,&local_30);
    object::~object(&local_30);
  }
  piVar1 = detail::get_internals();
  p_Var2 = (_Fwd_list_node_base *)operator_new(0x10);
  p_Var2->_M_next = (_Fwd_list_node_base *)0x0;
  p_Var2[1]._M_next =
       (_Fwd_list_node_base *)
       register_exception<ki::dml::parse_error>(pybind11::handle,char_const*,_object*)::
       {lambda(std::__exception_ptr::exception_ptr)#1}::exception_ptr_;
  p_Var2->_M_next =
       (piVar1->registered_exception_translators).
       super__Fwd_list_base<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
       ._M_impl._M_head._M_next;
  (piVar1->registered_exception_translators).
  super__Fwd_list_base<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  ._M_impl._M_head._M_next = p_Var2;
  return (exception<ki::dml::parse_error> *)this;
}

Assistant:

exception<CppException> &register_exception(handle scope,
                                            const char *name,
                                            PyObject *base = PyExc_Exception) {
    auto &ex = detail::get_exception_object<CppException>();
    if (!ex) ex = exception<CppException>(scope, name, base);

    register_exception_translator([](std::exception_ptr p) {
        if (!p) return;
        try {
            std::rethrow_exception(p);
        } catch (const CppException &e) {
            detail::get_exception_object<CppException>()(e.what());
        }
    });
    return ex;
}